

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O2

void testJacobiEigenSolver<Imath_2_5::Matrix33<double>>(Matrix33<double> *A)

{
  double *pdVar1;
  double *pdVar2;
  BaseType_conflict2 threshold;
  double dVar3;
  double dVar4;
  double (*padVar5) [3];
  size_t i;
  long lVar6;
  size_t j;
  Matrix33<double> *pMVar7;
  long lVar8;
  Matrix33<double> *pMVar9;
  byte bVar10;
  TV S;
  Matrix33<double> MS;
  Matrix33<double> V;
  Matrix33<double> local_138;
  Matrix33<double> local_f0;
  Matrix33<double> MA;
  Matrix33<double> AA;
  
  bVar10 = 0;
  threshold = computeThreshold<Imath_2_5::Matrix33<double>>(A);
  pMVar7 = A;
  pMVar9 = &AA;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    pMVar9->x[0][0] = pMVar7->x[0][0];
    pMVar7 = (Matrix33<double> *)((long)pMVar7 + ((ulong)bVar10 * -2 + 1) * 8);
    pMVar9 = (Matrix33<double> *)((long)pMVar9 + ((ulong)bVar10 * -2 + 1) * 8);
  }
  V.x[1][0] = 0.0;
  V.x[1][2] = 0.0;
  V.x[2][0] = 0.0;
  V.x[0][1] = 0.0;
  V.x[0][2] = 0.0;
  V.x[2][1] = 0.0;
  V.x[0][0] = 1.0;
  V.x[1][1] = 1.0;
  V.x[2][2] = 1.0;
  Imath_2_5::jacobiEigenSolver<double>(&AA,&S,&V);
  verifyOrthonormal<Imath_2_5::Matrix33<double>>(&V,threshold);
  dVar3 = Imath_2_5::Matrix33<double>::determinant(&V);
  if (threshold <= ABS(dVar3) + -1.0) {
    __assert_fail("abs(V.determinant()) - 1 < threshold",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                  ,0x8a,"void testJacobiEigenSolver(const TM &) [TM = Imath_2_5::Matrix33<double>]")
    ;
  }
  padVar5 = (double (*) [3])&MS;
  MS.x[1][0] = 0.0;
  MS.x[1][2] = 0.0;
  MS.x[2][0] = 0.0;
  MS.x[0][1] = 0.0;
  MS.x[0][2] = 0.0;
  MS.x[2][1] = 0.0;
  MS.x[0][0] = 1.0;
  MS.x[1][1] = 1.0;
  MS.x[2][2] = 1.0;
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      if (lVar6 == lVar8) {
        *(undefined8 *)((long)MS.x + lVar6 * 0x20) = *(undefined8 *)((long)(MS.x + -1) + lVar6 * 8);
      }
      else {
        (*(double (*) [3])*padVar5)[lVar8] = 0.0;
      }
    }
    padVar5 = padVar5 + 1;
  }
  dVar3 = Imath_2_5::Matrix33<double>::determinant(A);
  dVar4 = Imath_2_5::Matrix33<double>::determinant(&MS);
  if (ABS(dVar3) - ABS(dVar4) < threshold) {
    Imath_2_5::Matrix33<double>::operator*(&local_f0,&V,&MS);
    local_138.x[0][0] = V.x[0][0];
    local_138.x[0][1] = V.x[1][0];
    local_138.x[0][2] = V.x[2][0];
    local_138.x[1][0] = V.x[0][1];
    local_138.x[1][1] = V.x[1][1];
    local_138.x[1][2] = V.x[2][1];
    local_138.x[2][0] = V.x[0][2];
    local_138.x[2][1] = V.x[1][2];
    local_138.x[2][2] = V.x[2][2];
    padVar5 = (double (*) [3])&MA;
    Imath_2_5::Matrix33<double>::operator*((Matrix33<double> *)padVar5,&local_f0,&local_138);
    lVar6 = 0;
    do {
      if (lVar6 == 3) {
        return;
      }
      lVar8 = 0;
      while (lVar8 != 3) {
        pdVar1 = *(double (*) [3])*(double (*) [3])A + lVar8;
        pdVar2 = *(double (*) [3])*padVar5 + lVar8;
        lVar8 = lVar8 + 1;
        if (threshold <= ABS(*pdVar1 - *pdVar2)) {
          __assert_fail("abs(A[i][j]-MA[i][j]) < threshold",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x9d,
                        "void testJacobiEigenSolver(const TM &) [TM = Imath_2_5::Matrix33<double>]")
          ;
        }
      }
      lVar6 = lVar6 + 1;
      A = (Matrix33<double> *)((long)A + 0x18);
      padVar5 = padVar5 + 1;
    } while( true );
  }
  __assert_fail("abs(A.determinant()) - abs(MS.determinant()) < threshold",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                ,0x96,"void testJacobiEigenSolver(const TM &) [TM = Imath_2_5::Matrix33<double>]");
}

Assistant:

void
testJacobiEigenSolver(const TM& A)
{
    using std::abs;

    typedef typename TM::BaseType T;
    typedef typename TM::BaseVecType TV;

    const T threshold = computeThreshold(A);

    TM AA(A);
    TV S;
    TM V;

    jacobiEigenSolver(AA, S, V);

    // Orthogonality of V
    verifyOrthonormal(V, threshold);
 
    // Determinant of V
    assert(abs(V.determinant()) - 1 < threshold);

    // Determinant of A and S
    TM MS;
    for (size_t i = 0; i < TM::dimensions(); ++i)
        for (size_t j = 0; j < TM::dimensions(); ++j)
            if(i == j)
                MS[i][j] = S[i];
            else
                MS[i][j] = 0;

    assert(abs(A.determinant()) - abs(MS.determinant()) <
               threshold);

    // A = V * S * V^T
    TM MA = V * MS * V.transposed();

    for (size_t i = 0; i < TM::dimensions(); ++i) 
        for (size_t j =0; j < TM::dimensions(); ++j) 
            assert(abs(A[i][j]-MA[i][j]) < threshold);
}